

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O1

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  undefined4 in_EAX;
  int iVar8;
  int iVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  int *piVar20;
  float fVar21;
  undefined1 auVar22 [16];
  
  iVar9 = bottom_blob->w;
  iVar6 = bottom_blob->h;
  iVar7 = bottom_blob->c;
  uVar16 = iVar6 * iVar9;
  auVar22._0_4_ = -(uint)(DAT_0013323c._4_4_ == top_blob->dims);
  auVar22._4_4_ = -(uint)(iVar9 == top_blob->w);
  auVar22._8_4_ = -(uint)(iVar6 == top_blob->h);
  auVar22._12_4_ = -(uint)(iVar7 == top_blob->c);
  iVar8 = movmskps(in_EAX,auVar22);
  if ((iVar8 != 0xf) || (top_blob->elemsize != 4)) {
    piVar19 = top_blob->refcount;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if ((*piVar19 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = iVar9;
    top_blob->h = iVar6;
    top_blob->c = iVar7;
    uVar12 = (long)(int)uVar16 + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = uVar12;
    lVar14 = (long)iVar7 * uVar12;
    if (lVar14 != 0) {
      pvVar10 = malloc(lVar14 * 4 + 0x1c);
      pvVar11 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar11 - 8) = pvVar10;
      top_blob->data = pvVar11;
      piVar19 = (int *)((long)pvVar11 + lVar14 * 4);
      top_blob->refcount = piVar19;
      *piVar19 = 1;
    }
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  lVar14 = (long)iVar7;
  if (iVar7 == 0) {
    uVar12 = 0;
    piVar19 = (int *)0x0;
  }
  else {
    pvVar10 = malloc(lVar14 * 4 + 0x1c);
    uVar12 = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
    *(void **)(uVar12 - 8) = pvVar10;
    piVar19 = (int *)(lVar14 * 4 + uVar12);
    *piVar19 = 1;
  }
  iVar9 = -100;
  if ((uVar12 == 0) || (iVar7 == 0)) goto LAB_00110ce4;
  uVar15 = (ulong)uVar16;
  if (0 < iVar7) {
    pvVar10 = bottom_blob->data;
    sVar2 = bottom_blob->cstep;
    sVar3 = bottom_blob->elemsize;
    lVar13 = 0;
    do {
      fVar21 = 0.0;
      if (0 < (int)uVar16) {
        uVar17 = 0;
        do {
          fVar21 = fVar21 + *(float *)((long)pvVar10 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
      *(float *)(uVar12 + lVar13 * 4) = fVar21;
      lVar13 = lVar13 + 1;
      pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
    } while (lVar13 != lVar14);
  }
  if (this->across_channels == 0) {
    if (0 < iVar7) {
      pvVar10 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      pvVar11 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      sVar5 = bottom_blob->elemsize;
      lVar13 = 0;
      do {
        if (0 < (int)uVar16) {
          fVar21 = *(float *)(uVar12 + lVar13 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar11 + uVar17 * 4) =
                 *(float *)((long)pvVar10 + uVar17 * 4) - fVar21 * (1.0 / (float)(int)uVar16);
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        lVar13 = lVar13 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
        pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar5);
      } while (lVar13 != lVar14);
    }
  }
  else {
    fVar21 = 0.0;
    if (0 < iVar7) {
      lVar13 = 0;
      do {
        fVar21 = fVar21 + *(float *)(uVar12 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar14 != lVar13);
    }
    if (0 < iVar7) {
      pvVar10 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      pvVar11 = top_blob->data;
      sVar5 = bottom_blob->elemsize;
      lVar13 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar11 + uVar17 * 4) =
                 *(float *)((long)pvVar10 + uVar17 * 4) - fVar21 / (float)(int)(iVar7 * uVar16);
            uVar17 = uVar17 + 1;
          } while (uVar15 != uVar17);
        }
        lVar13 = lVar13 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
        pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar5);
      } while (lVar13 != lVar14);
    }
  }
  if (this->normalize_variance != 0) {
    if (iVar7 == 0) {
      uVar17 = 0;
      piVar20 = (int *)0x0;
    }
    else {
      pvVar10 = malloc(lVar14 * 4 + 0x1c);
      uVar17 = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar17 - 8) = pvVar10;
      piVar20 = (int *)(uVar17 + lVar14 * 4);
      *piVar20 = 1;
    }
    if (iVar7 == 0 || uVar17 == 0) {
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (uVar17 != 0 && *piVar20 == 0) {
          free(*(void **)(uVar17 - 8));
        }
      }
      iVar9 = -100;
      goto LAB_00110ce4;
    }
    if (0 < iVar7) {
      pvVar10 = top_blob->data;
      sVar2 = top_blob->cstep;
      sVar3 = top_blob->elemsize;
      lVar13 = 0;
      do {
        fVar21 = 0.0;
        if (0 < (int)uVar16) {
          uVar18 = 0;
          do {
            fVar1 = *(float *)((long)pvVar10 + uVar18 * 4);
            fVar21 = fVar21 + fVar1 * fVar1;
            uVar18 = uVar18 + 1;
          } while (uVar15 != uVar18);
        }
        *(float *)(uVar17 + lVar13 * 4) = fVar21;
        lVar13 = lVar13 + 1;
        pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
      } while (lVar13 != lVar14);
    }
    if (this->across_channels == 0) {
      if (0 < iVar7) {
        pvVar10 = top_blob->data;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        lVar13 = 0;
        do {
          if (0 < (int)uVar16) {
            fVar21 = *(float *)(uVar17 + lVar13 * 4);
            fVar1 = this->eps;
            uVar18 = 0;
            do {
              *(float *)((long)pvVar10 + uVar18 * 4) =
                   *(float *)((long)pvVar10 + uVar18 * 4) *
                   (1.0 / (SQRT(fVar21 * (1.0 / (float)(int)uVar16)) + fVar1));
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          lVar13 = lVar13 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
        } while (lVar13 != lVar14);
      }
    }
    else {
      fVar21 = 0.0;
      if (0 < iVar7) {
        lVar13 = 0;
        do {
          fVar21 = fVar21 + *(float *)(uVar17 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      if (0 < iVar7) {
        fVar1 = this->eps;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        pvVar10 = top_blob->data;
        lVar13 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar10 + uVar18 * 4) =
                   *(float *)((long)pvVar10 + uVar18 * 4) *
                   (1.0 / (SQRT(fVar21 / (float)(int)(iVar7 * uVar16)) + fVar1));
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          lVar13 = lVar13 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
        } while (lVar13 != lVar14);
      }
    }
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (uVar17 != 0 && *piVar20 == 0) {
        free(*(void **)(uVar17 - 8));
      }
    }
    iVar9 = -100;
    if (iVar7 == 0 || uVar17 == 0) goto LAB_00110ce4;
  }
  iVar9 = 0;
LAB_00110ce4:
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (uVar12 != 0 && *piVar19 == 0) {
      free(*(void **)(uVar12 - 8));
    }
  }
  return iVar9;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    top_blob.create(w, h, channels);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels);
    if (sum.empty())
        return -100;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}